

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::Preprocessor
          (Preprocessor *this,SourceManager *sourceManager,BumpAllocator *alloc,
          Diagnostics *diagnostics,Bag *options_,
          span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>
          inheritedMacros)

{
  flat_hash_map<std::string_view,_MacroDef> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  iterator __position;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  value_type *pvVar19;
  group_type_pointer pgVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  int iVar37;
  uint64_t hash;
  uint uVar38;
  value_type_pointer ppcVar39;
  ulong uVar40;
  size_t sVar41;
  ulong uVar42;
  long lVar43;
  group_type_pointer pgVar44;
  ulong uVar45;
  pointer ppDVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
  il;
  try_emplace_args_t local_501;
  Preprocessor *local_500;
  long local_4f8;
  string_view name;
  DefineDirectiveSyntax *define;
  NumberParser *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  LexerOptions *local_498;
  PreprocessorOptions *local_490;
  ulong local_488;
  size_t local_480;
  ulong local_478;
  ulong local_470;
  value_type *elements;
  long local_460;
  group_type_pointer local_458;
  char *local_450;
  uchar local_448;
  uchar uStack_447;
  uchar uStack_446;
  uchar uStack_445;
  uchar uStack_444;
  uchar uStack_443;
  uchar uStack_442;
  uchar uStack_441;
  uchar uStack_440;
  uchar uStack_43f;
  uchar uStack_43e;
  uchar uStack_43d;
  uchar uStack_43c;
  uchar uStack_43b;
  uchar uStack_43a;
  uchar uStack_439;
  locator res;
  
  this->sourceManager = sourceManager;
  this->alloc = alloc;
  this->diagnostics = diagnostics;
  Bag::getOrDefault<slang::parsing::PreprocessorOptions>(&this->options,options_);
  local_490 = &this->options;
  Bag::getOrDefault<slang::parsing::LexerOptions>(&this->lexerOptions,options_);
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .data_ = (pointer)(this->lexerStack).
                    super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                    .firstElement;
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .len = 0;
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .cap = 2;
  local_4a0 = (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.
              firstElement;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.data_ =
       (pointer)local_4a0;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.len = 0;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.cap = 2;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.groups_size_mask = 1;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  sVar41 = 0x1d;
  if ((this->macros).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
      .arrays.elements_ == (value_type_pointer)0x0) {
    sVar41 = 0;
  }
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .size_ctrl.ml = sVar41;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .size_ctrl.size = 0;
  local_4a8 = (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.firstElement;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_ = (pointer)local_4a8;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.cap = 2;
  this->currentMacroToken = (Token *)0x0;
  local_500 = this;
  local_498 = &this->lexerOptions;
  Token::Token(&this->currentToken);
  Token::Token(&this->lastConsumed);
  this->inMacroBody = false;
  this->inIfDefCondition = false;
  local_4b0 = (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.firstElement;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.data_ = (pointer)local_4b0
  ;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.cap = 2;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.groups_size_index = 0x3f;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.groups_size_mask = 1;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppcVar39 = (this->includeOnceHeaders).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
             .arrays.elements_;
  sVar41 = 0x1d;
  if (ppcVar39 != (value_type_pointer)0x0) {
    ppcVar39 = (value_type_pointer)0x1d;
  }
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .size_ctrl.ml = (size_t)ppcVar39;
  (this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  *(undefined1 (*) [16])
   &(this->includeOnceHeaders).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
    .size_ctrl.size = (undefined1  [16])0x0;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->defaultNetType = WireKeyword;
  this->unconnectedDrive = Unknown;
  this->cellDefine = false;
  this->designElementDepth = 0;
  this->includeDepth = 0;
  this->protectEncryptDepth = 0;
  this->protectDecryptDepth = 0;
  this->protectLineLength = 0;
  this->protectBytes = 0;
  this->protectEncoding = Raw;
  local_4b8 = &this->numberParser;
  NumberParser::NumberParser(local_4b8,diagnostics,alloc,(this->options).languageVersion);
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.groups_size_mask = 1;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  if ((this->pragmaProtectHandlers).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
      .arrays.elements_ == (value_type_pointer)0x0) {
    sVar41 = 0;
  }
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .size_ctrl.ml = sVar41;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .size_ctrl.size = 0;
  res.pg._0_1_ = LexerFacts::getDefaultKeywordVersion((this->options).languageVersion);
  __position._M_current =
       (this->keywordVersionStack).
       super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->keywordVersionStack).
      super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
    _M_realloc_insert<slang::parsing::KeywordVersion>
              (&this->keywordVersionStack,__position,(KeywordVersion *)&res);
  }
  else {
    *__position._M_current = (KeywordVersion)res.pg;
    (this->keywordVersionStack).
    super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
    ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if ((this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_engaged == true) {
    (this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
    super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  }
  this->defaultNetType = WireKeyword;
  this->unconnectedDrive = Unknown;
  this->cellDefine = false;
  resetProtectState(this);
  undefineAll(this);
  if (inheritedMacros._M_extent._M_extent_value != 0) {
    arrays_ = &this->macros;
    ppDVar46 = inheritedMacros._M_ptr + inheritedMacros._M_extent._M_extent_value;
    do {
      define = *inheritedMacros._M_ptr;
      name = Token::valueText(&define->name);
      if (name._M_len != 0) {
        hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          arrays_,&name);
        uVar42 = hash >> ((byte)(this->macros).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                                .arrays.groups_size_index & 0x3f);
        pgVar44 = (this->macros).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                  .arrays.groups_;
        lVar43 = (hash & 0xff) * 4;
        uVar49 = (&UNK_0046cabc)[lVar43];
        uVar50 = (&UNK_0046cabd)[lVar43];
        uVar51 = (&UNK_0046cabe)[lVar43];
        uVar52 = (&UNK_0046cabf)[lVar43];
        elements = (this->macros).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                   .arrays.elements_;
        sVar41 = name._M_len;
        local_450 = name._M_str;
        uVar40 = (ulong)((uint)hash & 7);
        local_480 = (this->macros).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                    .arrays.groups_size_mask;
        uVar45 = 0;
        uVar53 = uVar49;
        uVar54 = uVar50;
        uVar55 = uVar51;
        uVar56 = uVar52;
        uVar57 = uVar49;
        uVar58 = uVar50;
        uVar59 = uVar51;
        uVar60 = uVar52;
        uVar61 = uVar49;
        uVar62 = uVar50;
        uVar63 = uVar51;
        uVar64 = uVar52;
        local_470 = uVar42;
        do {
          pvVar19 = elements;
          local_460 = uVar42 * 0x10;
          pgVar2 = pgVar44 + uVar42;
          auVar48[0] = -(pgVar2->m[0].n == uVar49);
          auVar48[1] = -(pgVar2->m[1].n == uVar50);
          auVar48[2] = -(pgVar2->m[2].n == uVar51);
          auVar48[3] = -(pgVar2->m[3].n == uVar52);
          auVar48[4] = -(pgVar2->m[4].n == uVar53);
          auVar48[5] = -(pgVar2->m[5].n == uVar54);
          auVar48[6] = -(pgVar2->m[6].n == uVar55);
          auVar48[7] = -(pgVar2->m[7].n == uVar56);
          auVar48[8] = -(pgVar2->m[8].n == uVar57);
          auVar48[9] = -(pgVar2->m[9].n == uVar58);
          auVar48[10] = -(pgVar2->m[10].n == uVar59);
          auVar48[0xb] = -(pgVar2->m[0xb].n == uVar60);
          auVar48[0xc] = -(pgVar2->m[0xc].n == uVar61);
          auVar48[0xd] = -(pgVar2->m[0xd].n == uVar62);
          auVar48[0xe] = -(pgVar2->m[0xe].n == uVar63);
          auVar48[0xf] = -(pgVar2->m[0xf].n == uVar64);
          local_478 = uVar42;
          pgVar20 = pgVar44;
          uVar21 = uVar49;
          uVar22 = uVar50;
          uVar23 = uVar51;
          uVar24 = uVar52;
          uVar25 = uVar53;
          uVar26 = uVar54;
          uVar27 = uVar55;
          uVar28 = uVar56;
          uVar29 = uVar57;
          uVar30 = uVar58;
          uVar31 = uVar59;
          uVar32 = uVar60;
          uVar33 = uVar61;
          uVar34 = uVar62;
          uVar35 = uVar63;
          uVar36 = uVar64;
          pgVar2 = local_458;
          uVar3 = local_448;
          uVar4 = uStack_447;
          uVar5 = uStack_446;
          uVar6 = uStack_445;
          uVar7 = uStack_444;
          uVar8 = uStack_443;
          uVar9 = uStack_442;
          uVar10 = uStack_441;
          uVar11 = uStack_440;
          uVar12 = uStack_43f;
          uVar13 = uStack_43e;
          uVar14 = uStack_43d;
          uVar15 = uStack_43c;
          uVar16 = uStack_43b;
          uVar17 = uStack_43a;
          uVar18 = uStack_439;
          for (uVar38 = (uint)(ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe);
              uStack_439 = uVar36, uStack_43a = uVar35, uStack_43b = uVar34, uStack_43c = uVar33,
              uStack_43d = uVar32, uStack_43e = uVar31, uStack_43f = uVar30, uStack_440 = uVar29,
              uStack_441 = uVar28, uStack_442 = uVar27, uStack_443 = uVar26, uStack_444 = uVar25,
              uStack_445 = uVar24, uStack_446 = uVar23, uStack_447 = uVar22, local_448 = uVar21,
              local_458 = pgVar20, uVar38 != 0; uVar38 = uVar38 - 1 & uVar38) {
            iVar37 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> iVar37 & 1) == 0; iVar37 = iVar37 + 1) {
              }
            }
            bVar47 = sVar41 == *(size_t *)
                                ((long)&pvVar19[uVar42 * 0xf].first._M_len +
                                (ulong)(uint)(iVar37 << 5));
            lVar43 = (long)&pvVar19[uVar42 * 0xf].first._M_len + (ulong)(uint)(iVar37 << 5);
            local_488 = uVar40;
            if (bVar47 && sVar41 != 0) {
              iVar37 = bcmp(local_450,*(void **)(lVar43 + 8),sVar41);
              bVar47 = iVar37 == 0;
              pgVar44 = local_458;
              this = local_500;
              uVar49 = local_448;
              uVar50 = uStack_447;
              uVar51 = uStack_446;
              uVar52 = uStack_445;
              uVar53 = uStack_444;
              uVar54 = uStack_443;
              uVar55 = uStack_442;
              uVar56 = uStack_441;
              uVar57 = uStack_440;
              uVar58 = uStack_43f;
              uVar59 = uStack_43e;
              uVar60 = uStack_43d;
              uVar61 = uStack_43c;
              uVar62 = uStack_43b;
              uVar63 = uStack_43a;
              uVar64 = uStack_439;
            }
            if (bVar47) goto LAB_001994aa;
            uVar40 = local_488;
            pgVar20 = local_458;
            uVar21 = local_448;
            uVar22 = uStack_447;
            uVar23 = uStack_446;
            uVar24 = uStack_445;
            uVar25 = uStack_444;
            uVar26 = uStack_443;
            uVar27 = uStack_442;
            uVar28 = uStack_441;
            uVar29 = uStack_440;
            uVar30 = uStack_43f;
            uVar31 = uStack_43e;
            uVar32 = uStack_43d;
            uVar33 = uStack_43c;
            uVar34 = uStack_43b;
            uVar35 = uStack_43a;
            uVar36 = uStack_439;
            pgVar2 = local_458;
            uVar3 = local_448;
            uVar4 = uStack_447;
            uVar5 = uStack_446;
            uVar6 = uStack_445;
            uVar7 = uStack_444;
            uVar8 = uStack_443;
            uVar9 = uStack_442;
            uVar10 = uStack_441;
            uVar11 = uStack_440;
            uVar12 = uStack_43f;
            uVar13 = uStack_43e;
            uVar14 = uStack_43d;
            uVar15 = uStack_43c;
            uVar16 = uStack_43b;
            uVar17 = uStack_43a;
            uVar18 = uStack_439;
          }
          local_458 = pgVar2;
          local_448 = uVar3;
          uStack_447 = uVar4;
          uStack_446 = uVar5;
          uStack_445 = uVar6;
          uStack_444 = uVar7;
          uStack_443 = uVar8;
          uStack_442 = uVar9;
          uStack_441 = uVar10;
          uStack_440 = uVar11;
          uStack_43f = uVar12;
          uStack_43e = uVar13;
          uStack_43d = uVar14;
          uStack_43c = uVar15;
          uStack_43b = uVar16;
          uStack_43a = uVar17;
          uStack_439 = uVar18;
          if ((pgVar44->m[local_460 + 0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[uVar40]) == 0) break;
          lVar43 = local_478 + uVar45;
          uVar45 = uVar45 + 1;
          uVar42 = lVar43 + 1U & local_480;
        } while (uVar45 <= local_480);
        local_4f8 = 0;
        lVar43 = local_4f8;
LAB_001994aa:
        local_4f8 = lVar43;
        if (local_4f8 == 0) {
          if ((this->macros).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
              .size_ctrl.size <
              (this->macros).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
              .size_ctrl.ml) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
            ::
            nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::DefineDirectiveSyntax_const*&>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                             *)arrays_,(arrays_type *)arrays_,local_470,hash,&local_501,&name,
                       &define);
            psVar1 = &(this->macros).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                      .size_ctrl.size;
            *psVar1 = *psVar1 + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::DefineDirectiveSyntax_const*&>
                      (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                             *)arrays_,hash,&local_501,&name,&define);
          }
        }
      }
      inheritedMacros._M_ptr = inheritedMacros._M_ptr + 1;
    } while (inheritedMacros._M_ptr != ppDVar46);
  }
  memcpy((iterator)&res,&DAT_005b7990,0x400);
  il._M_len = 0x20;
  il._M_array = (iterator)&res;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  ::operator=(&this->pragmaProtectHandlers,il);
  return;
}

Assistant:

Preprocessor::Preprocessor(SourceManager& sourceManager, BumpAllocator& alloc,
                           Diagnostics& diagnostics, const Bag& options_,
                           std::span<const DefineDirectiveSyntax* const> inheritedMacros) :
    sourceManager(sourceManager), alloc(alloc), diagnostics(diagnostics),
    options(options_.getOrDefault<PreprocessorOptions>()),
    lexerOptions(options_.getOrDefault<LexerOptions>()),
    numberParser(diagnostics, alloc, options.languageVersion) {

    keywordVersionStack.push_back(LF::getDefaultKeywordVersion(options.languageVersion));
    resetAllDirectives();
    undefineAll();

    // Add in any inherited macros that aren't already set in our map.
    for (auto define : inheritedMacros) {
        auto name = define->name.valueText();
        if (!name.empty())
            macros.emplace(name, define);
    }

    // clang-format off
    pragmaProtectHandlers = {
        { "begin", &Preprocessor::handleProtectBegin },
        { "end", &Preprocessor::handleProtectEnd },
        { "begin_protected", &Preprocessor::handleProtectBeginProtected },
        { "end_protected", &Preprocessor::handleProtectEndProtected },
        { "author", &Preprocessor::handleProtectSingleArgIgnore },
        { "author_info", &Preprocessor::handleProtectSingleArgIgnore },
        { "encrypt_agent", &Preprocessor::handleProtectSingleArgIgnore },
        { "encrypt_agent_info", &Preprocessor::handleProtectSingleArgIgnore },
        { "encoding", &Preprocessor::handleProtectEncoding },
        { "data_keyowner", &Preprocessor::handleProtectSingleArgIgnore },
        { "data_method", &Preprocessor::handleProtectSingleArgIgnore },
        { "data_keyname", &Preprocessor::handleProtectSingleArgIgnore },
        { "data_public_key", &Preprocessor::handleProtectKey },
        { "data_decrypt_key", &Preprocessor::handleProtectKey },
        { "data_block", &Preprocessor::handleProtectBlock },
        { "digest_keyowner", &Preprocessor::handleProtectSingleArgIgnore },
        { "digest_key_method", &Preprocessor::handleProtectSingleArgIgnore },
        { "digest_keyname", &Preprocessor::handleProtectSingleArgIgnore },
        { "digest_public_key", &Preprocessor::handleProtectKey },
        { "digest_decrypt_key", &Preprocessor::handleProtectKey },
        { "digest_method", &Preprocessor::handleProtectSingleArgIgnore },
        { "digest_block", &Preprocessor::handleProtectBlock },
        { "key_keyowner", &Preprocessor::handleProtectSingleArgIgnore },
        { "key_method", &Preprocessor::handleProtectSingleArgIgnore },
        { "key_keyname", &Preprocessor::handleProtectSingleArgIgnore },
        { "key_public_key", &Preprocessor::handleProtectKey },
        { "key_block", &Preprocessor::handleProtectBlock },
        { "decrypt_license", &Preprocessor::handleProtectLicense },
        { "runtime_license", &Preprocessor::handleProtectLicense },
        { "comment", &Preprocessor::handleProtectSingleArgIgnore },
        { "reset", &Preprocessor::handleProtectReset },
        { "viewport", &Preprocessor::handleProtectViewport }
    };
    // clang-format on
}